

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataMarshaller.cpp
# Opt level: O0

void __thiscall
firmata::FirmataMarshaller::sendFirmwareVersion
          (FirmataMarshaller *this,uint8_t major,uint8_t minor,size_t bytec,uint8_t *bytev)

{
  FirmataMarshaller *__n;
  undefined7 in_register_00000011;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX;
  void *__buf_02;
  void *extraout_RDX_00;
  ulong local_30;
  size_t i;
  uint8_t *bytev_local;
  size_t bytec_local;
  uint8_t minor_local;
  uint8_t major_local;
  FirmataMarshaller *this_local;
  
  if (this->FirmataStream != (Stream *)0x0) {
    __n = this;
    serial_wiring::Stream::write
              (this->FirmataStream,0xf0,(void *)CONCAT71(in_register_00000011,major),(size_t)this);
    serial_wiring::Stream::write(this->FirmataStream,0x79,__buf,(size_t)__n);
    serial_wiring::Stream::write(this->FirmataStream,(uint)major,__buf_00,(size_t)__n);
    serial_wiring::Stream::write(this->FirmataStream,(uint)minor,__buf_01,(size_t)__n);
    __buf_02 = extraout_RDX;
    for (local_30 = 0; local_30 < bytec; local_30 = local_30 + 1) {
      __n = (FirmataMarshaller *)0x0;
      encodeByteStream(this,1,bytev + local_30,0);
      __buf_02 = extraout_RDX_00;
    }
    serial_wiring::Stream::write(this->FirmataStream,0xf7,__buf_02,(size_t)__n);
  }
  return;
}

Assistant:

void FirmataMarshaller::sendFirmwareVersion(uint8_t major, uint8_t minor, size_t bytec, uint8_t *bytev)
const
{
  if ( (Stream *)NULL == FirmataStream ) { return; }
  size_t i;
  FirmataStream->write(START_SYSEX);
  FirmataStream->write(REPORT_FIRMWARE);
  FirmataStream->write(major);
  FirmataStream->write(minor);
  for (i = 0; i < bytec; ++i) {
    encodeByteStream(sizeof(bytev[i]), reinterpret_cast<uint8_t *>(&bytev[i]));
  }
  FirmataStream->write(END_SYSEX);
}